

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdFinalizePsbt(void *handle,void *psbt_handle)

{
  string *message;
  CfdException *in_RSI;
  string *in_stack_00000028;
  void *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  allocator *paVar1;
  CfdException *this;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  CfdException *local_60;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  CfdException *local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"PsbtHandle",&local_51);
  cfd::capi::CheckBuffer(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_60 = local_18;
  if ((local_18->message_)._M_string_length == 0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x20c;
    local_78.funcname = "CfdFinalizePsbt";
    cfd::core::logger::warn<>(&local_78,"psbt is null.");
    message = (string *)__cxa_allocate_exception(0x30);
    paVar1 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to handle statement. psbt is null.",paVar1);
    cfd::core::CfdException::CfdException(this,(CfdError)((ulong)paVar1 >> 0x20),message);
    __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Psbt::Finalize((Psbt *)(local_18->message_)._M_string_length);
  return 0;
}

Assistant:

int CfdFinalizePsbt(void* handle, void* psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    psbt_obj->psbt->Finalize();
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}